

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

void write_word(char *w)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  
  if (needspace != 0) {
    putc(0x20,(FILE *)fout);
  }
  needspace = 1;
  if ((w == (char *)0x0) || (pcVar4 = w, *w == '\0')) {
    fwrite("{}",2,1,(FILE *)fout);
    return;
  }
  do {
    pcVar6 = pcVar4;
    iVar3 = is_id(*pcVar6);
    pcVar4 = pcVar6 + 1;
  } while (iVar3 != 0);
  if (*pcVar6 == '\0') {
    fputs(w,(FILE *)fout);
    return;
  }
  iVar3 = 0;
  pcVar4 = w;
  do {
    cVar2 = *pcVar4;
    if (cVar2 == '{') {
      iVar3 = iVar3 + 1;
    }
    else if (cVar2 == '}') {
      iVar5 = iVar3 + -1;
      bVar1 = iVar3 < 1;
      iVar3 = iVar5;
      if (bVar1) break;
    }
    else if (cVar2 == '\0') break;
    pcVar4 = pcVar4 + 1;
  } while( true );
  putc(0x7b,(FILE *)fout);
  do {
    cVar2 = *w;
    if ((cVar2 == '#') || (cVar2 == '\\')) {
LAB_00198064:
      putc(0x5c,(FILE *)fout);
      cVar2 = *w;
    }
    else if ((cVar2 == '{') || (cVar2 == '}')) {
      if (iVar3 != 0) goto LAB_00198064;
    }
    else if (cVar2 == '\0') {
      putc(0x7d,(FILE *)fout);
      return;
    }
    putc((int)cVar2,(FILE *)fout);
    w = w + 1;
  } while( true );
}

Assistant:

void write_word(const char *w) {
  if (needspace) putc(' ', fout);
  needspace = 1;
  if (!w || !*w) {fprintf(fout,"{}"); return;}
  const char *p;
  // see if it is a single word:
  for (p = w; is_id(*p); p++) ;
  if (!*p) {fprintf(fout,"%s",w); return;}
  // see if there are matching braces:
  int n = 0;
  for (p = w; *p; p++) {
    if (*p == '{') n++;
    else if (*p == '}') {n--; if (n<0) break;}
  }
  int mismatched = (n != 0);
  // write out brace-quoted string:
  putc('{', fout);
  for (; *w; w++) {
    switch (*w) {
    case '{':
    case '}':
      if (!mismatched) break;
    case '\\':
    case '#':
      putc('\\',fout);
      break;
    }
    putc(*w,fout);
  }
  putc('}', fout);
}